

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

uint __thiscall
ON_SubDDisplayParameters::DisplayDensity(ON_SubDDisplayParameters *this,ON_SubD *subd)

{
  byte bVar1;
  uint uVar2;
  ON_SubDFace *pOVar3;
  ON_SubDFaceIdIterator fit;
  
  bVar1 = this->m_display_density;
  if (this->m_bDisplayDensityIsAbsolute == false) {
    uVar2 = AbsoluteDisplayDensityFromSubD((uint)bVar1,subd);
    return uVar2;
  }
  if (bVar1 == 0) {
    ON_SubDFaceIdIterator::ON_SubDFaceIdIterator(&fit,subd);
    pOVar3 = ON_SubDFaceIdIterator::FirstFace(&fit);
    while (pOVar3 != (ON_SubDFace *)0x0) {
      if (0x13 < (ushort)(pOVar3->m_edge_count + 0xf)) {
        ON_SubDRef::~ON_SubDRef(&fit.m_subd_ref);
        return 1;
      }
      pOVar3 = ON_SubDFaceIdIterator::NextFace(&fit);
    }
    ON_SubDRef::~ON_SubDRef(&fit.m_subd_ref);
  }
  return (uint)bVar1;
}

Assistant:

unsigned int ON_SubDDisplayParameters::DisplayDensity(const ON_SubD& subd) const
{
  const unsigned display_density = this->m_display_density;
  const unsigned absolute_display_density
    = this->DisplayDensityIsAdaptive() 
    ? ON_SubDDisplayParameters::AbsoluteDisplayDensityFromSubD(display_density, subd)
    : display_density
    ;

  if (0 == absolute_display_density)
  {
    // If subd has ngons with n != 4, then the display density has to be >= 1.
    ON_SubDFaceIdIterator fit(subd);
    for (const ON_SubDFace* f = fit.FirstFace(); nullptr != f; f = fit.NextFace())
    {
      if (4 != f->m_edge_count && f->m_edge_count > 3 && f->m_edge_count <= ON_SubDFace::MaximumEdgeCount)
      {
        // This face will have f->m_edge_count subd mesh fragments of density 0.
        // That's why the default quad face density must be >= 1.
        return 1u;
      }
    }
  }

  return absolute_display_density;
}